

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

void __thiscall cmFileLockPool::~cmFileLockPool(cmFileLockPool *this)

{
  cmDeleteAll<std::__cxx11::list<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>>
            (&this->FunctionScopes);
  cmDeleteAll<std::__cxx11::list<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>>
            (&this->FileScopes);
  ScopePool::~ScopePool(&this->ProcessScope);
  std::__cxx11::
  _List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::_M_clear
            (&(this->FileScopes).
              super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            );
  std::__cxx11::
  _List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::_M_clear
            ((_List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
              *)this);
  return;
}

Assistant:

cmFileLockPool::~cmFileLockPool()
{
  cmDeleteAll(this->FunctionScopes);
  cmDeleteAll(this->FileScopes);
}